

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fence.cpp
# Opt level: O0

void __thiscall myvk::Fence::~Fence(Fence *this)

{
  void *in_RDI;
  Fence *unaff_retaddr;
  
  ~Fence(unaff_retaddr);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

Fence::~Fence() {
	if (m_fence)
		vkDestroyFence(m_device_ptr->GetHandle(), m_fence, nullptr);
}